

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  complex<float> *pcVar1;
  complex<float> *__z;
  complex<float> *pcVar2;
  int64_t iVar3;
  complex<float> **ppcVar4;
  TPZBaseMatrix *in_RSI;
  complex<float> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  complex<float> *BPtr;
  complex<float> *end_ki;
  complex<float> *elem_ki;
  complex<float> sum;
  int64_t k;
  int64_t j;
  int64_t dimension;
  char *in_stack_00000178;
  char *in_stack_00000180;
  complex<float> *in_stack_ffffffffffffff78;
  bool local_79;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffffa0;
  complex<float> *local_40;
  complex<float> local_38;
  complex<float> local_30;
  long local_28;
  complex<float> *local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  __z = (complex<float> *)TPZBaseMatrix::Rows(in_RSI);
  pcVar2 = (complex<float> *)(**(code **)(in_RDI->_M_value + 0x60))();
  if ((__z != pcVar2) || ((char)in_RDI[3]._M_value != '\x03')) {
    TPZMatrix<std::complex<float>_>::Error(in_stack_00000180,in_stack_00000178);
  }
  local_18 = (**(code **)(in_RDI->_M_value + 0x60))();
  local_20 = (complex<float> *)0x0;
  while (pcVar2 = local_20, iVar3 = TPZBaseMatrix::Cols(local_10), (long)pcVar2 < iVar3) {
    local_28 = 0;
    while( true ) {
      local_79 = false;
      if (local_28 < local_18) {
        in_stack_ffffffffffffff78 =
             TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_ffffffffffffffa0,(int64_t)__z,(int64_t)in_RDI);
        std::complex<float>::complex(&local_30,0.0,0.0);
        local_79 = std::operator==(in_RDI,pcVar2);
      }
      if (local_79 == false) break;
      local_28 = local_28 + 1;
    }
    for (; local_28 < local_18; local_28 = local_28 + 1) {
      std::complex<float>::complex(&local_38,0.0,0.0);
      ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                          ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_28);
      local_40 = *ppcVar4;
      ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                          ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_28 + 1);
      pcVar1 = *ppcVar4;
      TPZFMatrix<std::complex<float>_>::operator()
                (in_stack_ffffffffffffffa0,(int64_t)__z,(int64_t)in_RDI);
      while (local_40 = local_40 + 1, local_40 < pcVar1) {
        std::conj<float>(in_stack_ffffffffffffff78);
        in_stack_ffffffffffffffa0 =
             (TPZFMatrix<std::complex<float>_> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        std::operator*(in_stack_ffffffffffffff78,(complex<float> *)0x136fbbf);
        std::complex<float>::operator+=(in_RDI,pcVar2);
      }
      TPZFMatrix<std::complex<float>_>::operator()
                (in_stack_ffffffffffffffa0,(int64_t)__z,(int64_t)in_RDI);
      std::complex<float>::operator-=(in_RDI,pcVar2);
      TPZVec<std::complex<float>_*>::operator[]
                ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_28);
      std::complex<float>::operator/=((complex<float> *)in_stack_ffffffffffffffa0,__z);
    }
    local_20 = (complex<float> *)((long)&local_20->_M_value + 1);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}